

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::CommandQueueVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::CommandQueueVkImpl>::operator=
          (RefCntAutoPtr<Diligent::CommandQueueVkImpl> *this,CommandQueueVkImpl *pObj)

{
  CommandQueueVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (CommandQueueVkImpl *)0x0) {
      RefCountedObject<Diligent::ICommandQueueVk>::Release
                ((RefCountedObject<Diligent::ICommandQueueVk> *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (CommandQueueVkImpl *)0x0) {
      RefCountedObject<Diligent::ICommandQueueVk>::AddRef
                ((RefCountedObject<Diligent::ICommandQueueVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }